

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headergen.c
# Opt level: O1

void printhead(fout f,rnndb *db)

{
  int iVar1;
  uint uVar2;
  char **ppcVar3;
  ulong uVar4;
  size_t sVar5;
  rnnauthor *prVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  stat sb;
  tm local_f8;
  stat local_c0;
  
  stat(f.name,&local_c0);
  gmtime_r(&local_c0.st_mtim.tv_sec,&local_f8);
  iVar11 = 0;
  fprintf((FILE *)f.file,"#ifndef %s\n",f.guard);
  fprintf((FILE *)f.file,"#define %s\n",f.guard);
  fputc(10,(FILE *)f.file);
  fwrite("/* Autogenerated file, DO NOT EDIT manually!\n\nThis file was generated by the rules-ng-ng headergen tool in this git repository:\nhttp://0x04.net/cgit/index.cgi/rules-ng-ng\ngit clone git://0x04.net/rules-ng-ng\n\nThe rules-ng-ng source files this header was generated from are:\n"
         ,0x112,1,(FILE *)f.file);
  iVar1 = db->filesnum;
  if (0 < (long)iVar1) {
    ppcVar3 = db->files;
    lVar8 = 0;
    uVar10 = 0;
    do {
      sVar5 = strlen(ppcVar3[lVar8]);
      uVar4 = sVar5 & 0xffffffff;
      if ((uint)sVar5 < (uint)uVar10) {
        uVar4 = uVar10;
      }
      uVar10 = uVar4;
      iVar11 = (int)uVar10;
      lVar8 = lVar8 + 1;
    } while (iVar1 != lVar8);
  }
  if (0 < db->filesnum) {
    lVar8 = 0;
    do {
      pcVar7 = db->files[lVar8];
      sVar5 = strlen(pcVar7);
      fprintf((FILE *)f.file,"- %s%*s ",pcVar7,(ulong)(uint)(iVar11 - (int)sVar5),"");
      print_file_info(f.file,db->files[lVar8]);
      lVar8 = lVar8 + 1;
    } while (lVar8 < db->filesnum);
  }
  fwrite("\nCopyright (C) ",0xf,1,(FILE *)f.file);
  uVar2 = (db->copyright).firstyear;
  if ((uVar2 != 0) && (uVar2 < local_f8.tm_year + 0x76cU)) {
    fprintf((FILE *)f.file,"%u-");
  }
  fprintf((FILE *)f.file,"%u",(ulong)(local_f8.tm_year + 0x76c));
  if ((db->copyright).authorsnum != 0) {
    fwrite(" by the following authors:",0x1a,1,(FILE *)f.file);
    if (0 < (db->copyright).authorsnum) {
      lVar8 = 0;
      do {
        fwrite("\n- ",3,1,(FILE *)f.file);
        pcVar7 = (db->copyright).authors[lVar8]->name;
        if (pcVar7 != (char *)0x0) {
          fputs(pcVar7,(FILE *)f.file);
        }
        if ((db->copyright).authors[lVar8]->email != (char *)0x0) {
          fprintf((FILE *)f.file," <%s>");
        }
        if ((db->copyright).authors[lVar8]->nicknamesnum != 0) {
          prVar6 = (db->copyright).authors[lVar8];
          if (0 < prVar6->nicknamesnum) {
            lVar9 = 0;
            do {
              pcVar7 = ", ";
              if (lVar9 == 0) {
                pcVar7 = " (";
              }
              fprintf((FILE *)f.file,"%s%s",pcVar7,prVar6->nicknames[lVar9]);
              lVar9 = lVar9 + 1;
              prVar6 = (db->copyright).authors[lVar8];
            } while (lVar9 < prVar6->nicknamesnum);
          }
          fputc(0x29,(FILE *)f.file);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < (db->copyright).authorsnum);
    }
  }
  fputc(10,(FILE *)f.file);
  if ((db->copyright).license != (char *)0x0) {
    fprintf((FILE *)f.file,"\n%s\n");
  }
  fwrite("*/\n\n\n",5,1,(FILE *)f.file);
  return;
}

Assistant:

void printhead(struct fout f, struct rnndb *db) {
	int i, j;
	struct stat sb;
	struct tm tm;
	stat(f.name, &sb);
	gmtime_r(&sb.st_mtime, &tm);
	fprintf (f.file, "#ifndef %s\n", f.guard);
	fprintf (f.file, "#define %s\n", f.guard);
	fprintf (f.file, "\n");
	fprintf(f.file,
		"/* Autogenerated file, DO NOT EDIT manually!\n"
		"\n"
		"This file was generated by the rules-ng-ng headergen tool in this git repository:\n"
		"http://0x04.net/cgit/index.cgi/rules-ng-ng\n"
		"git clone git://0x04.net/rules-ng-ng\n"
		"\n"
		"The rules-ng-ng source files this header was generated from are:\n");
	unsigned maxlen = 0;
	for(i = 0; i < db->filesnum; ++i) {
		unsigned len = strlen(db->files[i]);
		if(len > maxlen)
			maxlen = len;
	}
	for(i = 0; i < db->filesnum; ++i) {
		unsigned len = strlen(db->files[i]);
		fprintf(f.file, "- %s%*s ", db->files[i], maxlen - len, "");
		print_file_info(f.file, db->files[i]);
	}
	fprintf(f.file,
		"\n"
		"Copyright (C) ");
	if(db->copyright.firstyear && db->copyright.firstyear < (1900 + tm.tm_year))
		fprintf(f.file, "%u-", db->copyright.firstyear);
	fprintf(f.file, "%u", 1900 + tm.tm_year);
	if(db->copyright.authorsnum) {
		fprintf(f.file, " by the following authors:");
		for(i = 0; i < db->copyright.authorsnum; ++i) {
			fprintf(f.file, "\n- ");
			if(db->copyright.authors[i]->name)
				fprintf(f.file, "%s", db->copyright.authors[i]->name);
			if(db->copyright.authors[i]->email)
				fprintf(f.file, " <%s>", db->copyright.authors[i]->email);
			if(db->copyright.authors[i]->nicknamesnum) {
				for(j = 0; j < db->copyright.authors[i]->nicknamesnum; ++j) {
					fprintf(f.file, "%s%s", (j ? ", " : " ("), db->copyright.authors[i]->nicknames[j]);
				}
				fprintf(f.file, ")");
			}
		}
	}
	fprintf(f.file, "\n");
	if(db->copyright.license)
		fprintf(f.file, "\n%s\n", db->copyright.license);
	fprintf(f.file, "*/\n\n\n");
}